

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

BasicBlock * __thiscall flow::IRBuilder::createBlock(IRBuilder *this,string *name)

{
  BasicBlock *pBVar1;
  undefined1 local_38 [8];
  string n;
  string *name_local;
  IRBuilder *this_local;
  
  n.field_2._8_8_ = name;
  makeName((string *)local_38,this,name);
  pBVar1 = IRHandler::createBlock(this->handler_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return pBVar1;
}

Assistant:

BasicBlock* IRBuilder::createBlock(const std::string& name) {
  std::string n = makeName(name);
  return handler_->createBlock(n);
}